

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

int __thiscall Fl_Help_View::find(Fl_Help_View *this,char *s,int p)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char cVar4;
  char *pcVar5;
  Fl_Help_Block *pFVar6;
  int iVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  ulong local_50;
  char *local_38;
  
  if ((s != (char *)0x0) && (this->value_ != (char *)0x0)) {
    if (p < 0) {
      local_50 = 0;
    }
    else {
      sVar3 = strlen(this->value_);
      local_50 = 0;
      if ((p != 0) && (p < (int)sVar3)) {
        local_50 = (ulong)(p + 1);
      }
    }
    if (0 < this->nblocks_) {
      pFVar6 = this->blocks_;
      iVar9 = this->nblocks_;
      do {
        pcVar5 = this->value_ + local_50;
        if (pcVar5 <= pFVar6->end) {
          bVar10 = *s == '\0';
          if (bVar10) {
LAB_001b2a23:
            topline(this,pFVar6->y - pFVar6->h);
            return *(int *)&pFVar6->end - *(int *)&this->value_;
          }
          pcVar8 = pFVar6->start;
          if (pFVar6->start < pcVar5) {
            pcVar8 = pcVar5;
          }
          cVar4 = *pcVar8;
          pcVar5 = s;
          local_38 = pcVar8;
          for (; (cVar4 != '\0' && (pcVar8 < pFVar6->end)); pcVar8 = pcVar8 + 1) {
            if (cVar4 == '&') {
              iVar7 = quote_char(pcVar8 + 1);
              if (iVar7 < 0) {
                iVar7 = 0x26;
              }
              else {
                pcVar8 = strchr(pcVar8 + 1,0x3b);
                pcVar8 = pcVar8 + 1;
              }
LAB_001b29b6:
              iVar2 = tolower((int)*pcVar5);
              iVar7 = tolower(iVar7);
              if (iVar2 == iVar7) {
                pcVar5 = pcVar5 + 1;
              }
              else {
                pcVar8 = local_38 + 1;
                pcVar5 = s;
                local_38 = pcVar8;
              }
            }
            else {
              if (cVar4 != '<') {
                iVar7 = (int)cVar4;
                goto LAB_001b29b6;
              }
              cVar4 = *pcVar8;
              while (((cVar4 != '\0' && (pcVar8 < pFVar6->end)) && (cVar4 != '>'))) {
                pcVar1 = pcVar8 + 1;
                pcVar8 = pcVar8 + 1;
                cVar4 = *pcVar1;
              }
            }
            bVar10 = *pcVar5 == '\0';
            if (bVar10) goto LAB_001b2a23;
            cVar4 = pcVar8[1];
          }
          if (bVar10) goto LAB_001b2a23;
        }
        pFVar6 = pFVar6 + 1;
        bVar10 = 1 < iVar9;
        iVar9 = iVar9 + -1;
      } while (bVar10);
    }
  }
  return -1;
}

Assistant:

int						// O - Matching position or -1 if not found
Fl_Help_View::find(const char *s,		// I - String to find
                   int        p)		// I - Starting position
{
  int		i,				// Looping var
		c;				// Current character
  Fl_Help_Block	*b;				// Current block
  const char	*bp,				// Block matching pointer
		*bs,				// Start of current comparison
		*sp;				// Search string pointer


  DEBUG_FUNCTION(__LINE__,__FUNCTION__);

  // Range check input and value...
  if (!s || !value_) return -1;

  if (p < 0 || p >= (int)strlen(value_)) p = 0;
  else if (p > 0) p ++;

  // Look for the string...
  for (i = nblocks_, b = blocks_; i > 0; i --, b ++) {
    if (b->end < (value_ + p))
      continue;

    if (b->start < (value_ + p)) bp = value_ + p;
    else bp = b->start;

    for (sp = s, bs = bp; *sp && *bp && bp < b->end; bp ++) {
      if (*bp == '<') {
        // skip to end of element...
	while (*bp && bp < b->end && *bp != '>') bp ++;
	continue;
      } else if (*bp == '&') {
        // decode HTML entity...
	if ((c = quote_char(bp + 1)) < 0) c = '&';	// *FIXME* UTF-8, see below
	else bp = strchr(bp + 1, ';') + 1;
      } else c = *bp;

      // *FIXME* *UTF-8* (A.S. 02/14/2016)
      // At this point c may be an arbitrary Unicode Code Point corresponding
      // to a quoted character (see above), i.e. it _can_ be a multi byte
      // UTF-8 sequence and must be compared with the corresponding
      // multi byte string in (*sp)...
      // For instance: "&euro;" == 0x20ac -> 0xe2 0x82 0xac (UTF-8: 3 bytes).
      // Hint: use fl_utf8encode() [see below]

      if (tolower(*sp) == tolower(c)) sp ++;
      else {
        // No match, so reset to start of search...
	sp = s;
	bs ++;
	bp = bs;
      }
    }

    if (!*sp) {
      // Found a match!
      topline(b->y - b->h);
      return (int) (b->end - value_);
    }
  }

  // No match!
  return (-1);
}